

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

void QCoreApplication::processEvents(ProcessEventsFlags flags,QDeadlineTimer deadline)

{
  long lVar1;
  bool bVar2;
  ProcessEventsFlags PVar3;
  uint uVar4;
  QThreadData *pQVar5;
  Type pQVar6;
  QDeadlineTimer *in_RSI;
  long in_FS_OFFSET;
  QThreadData *data;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = QThreadData::current();
  bVar2 = QThreadData::hasEventDispatcher((QThreadData *)0x33f328);
  if (bVar2) {
    do {
      pQVar6 = QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                         ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x33f33e);
      PVar3 = ::operator~(in_stack_ffffffffffffffd4.i);
      in_stack_ffffffffffffffd4.i =
           (Int)QFlags<QEventLoop::ProcessEventsFlag>::operator&
                          ((QFlags<QEventLoop::ProcessEventsFlag> *)
                           CONCAT44(in_stack_ffffffffffffffd4.i,
                                    PVar3.
                                    super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                                    super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i),
                           (QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)SUB84(pQVar5,0));
      uVar4 = (*(pQVar6->super_QObject)._vptr_QObject[0xc])
                        (pQVar6,(ulong)in_stack_ffffffffffffffd4.i);
      if ((uVar4 & 1) == 0) break;
      bVar2 = QDeadlineTimer::hasExpired(in_RSI);
    } while (!bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCoreApplication::processEvents(QEventLoop::ProcessEventsFlags flags, QDeadlineTimer deadline)
{
    // ### TODO: consider splitting this method into a public and a private
    //           one, so that a user-invoked processEvents can be detected
    //           and handled properly.
    QThreadData *data = QThreadData::current();
    if (!data->hasEventDispatcher())
        return;

    while (data->eventDispatcher.loadRelaxed()->processEvents(flags & ~QEventLoop::WaitForMoreEvents)) {
        if (deadline.hasExpired())
            break;
    }
}